

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall MixedArena::clear(MixedArena *this)

{
  pointer ppvVar1;
  vector<void_*,_std::allocator<void_*>_> *__range1;
  pointer ppvVar2;
  
  ppvVar1 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppvVar2 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppvVar2 != ppvVar1; ppvVar2 = ppvVar2 + 1) {
    free(*ppvVar2);
  }
  ppvVar2 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar2) {
    (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar2;
  }
  return;
}

Assistant:

void clear() {
    for (auto* chunk : chunks) {
      wasm::aligned_free(chunk);
    }
    chunks.clear();
  }